

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
::Visit<google::protobuf::DescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  EnumDescriptor *pEVar1;
  OneofDescriptor *pOVar2;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  ExtensionRange *pEVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *proto_03;
  long lVar7;
  long lVar8;
  
  DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::Descriptor>
            (*(DescriptorBuilder **)this,descriptor->file_->edition_,proto,descriptor,
             descriptor->options_,*(FlatAllocator **)(this + 8),NAME,false);
  if (0 < descriptor->enum_type_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pEVar1 = descriptor->enum_types_;
      proto_00 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar8);
      Visit<google::protobuf::EnumDescriptorProto_const>
                (this,(EnumDescriptor *)(&pEVar1->super_SymbolBase + lVar7),proto_00);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar8 < descriptor->enum_type_count_);
  }
  if (0 < descriptor->oneof_decl_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pOVar2 = descriptor->oneof_decls_;
      proto_01 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                           (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                            (int)lVar8);
      DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::OneofDescriptor>
                (*(DescriptorBuilder **)this,
                 *(Edition *)
                  (*(long *)(*(long *)((long)&pOVar2->containing_type_ + lVar7) + 0x18) + 0x20),
                 proto_01,(OneofDescriptor *)(&pOVar2->super_SymbolBase + lVar7),
                 *(OptionsType **)((long)&pOVar2->options_ + lVar7),*(FlatAllocator **)(this + 8),
                 NAME,false);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x38;
    } while (lVar8 < descriptor->oneof_decl_count_);
  }
  if (0 < descriptor->field_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pFVar3 = descriptor->fields_;
      pVVar6 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,(int)lVar8);
      DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
                (*(DescriptorBuilder **)this,
                 *(Edition *)(*(long *)((long)&pFVar3->file_ + lVar7) + 0x20),pVVar6,
                 (FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar7),
                 *(OptionsType **)((long)&pFVar3->options_ + lVar7),*(FlatAllocator **)(this + 8),
                 NAME,false);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar8 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pDVar4 = descriptor->nested_types_;
      proto_02 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar8);
      Visit<google::protobuf::DescriptorProto_const>
                (this,(Descriptor *)(&pDVar4->super_SymbolBase + lVar7),proto_02);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0xa0;
    } while (lVar8 < descriptor->nested_type_count_);
  }
  if (0 < descriptor->extension_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pFVar3 = descriptor->extensions_;
      pVVar6 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,(int)lVar8)
      ;
      DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::FieldDescriptor>
                (*(DescriptorBuilder **)this,
                 *(Edition *)(*(long *)((long)&pFVar3->file_ + lVar7) + 0x20),pVVar6,
                 (FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar7),
                 *(OptionsType **)((long)&pFVar3->options_ + lVar7),*(FlatAllocator **)(this + 8),
                 NAME,false);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x58;
    } while (lVar8 < descriptor->extension_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pEVar5 = descriptor->extension_ranges_;
      proto_03 = RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                           (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                            (int)lVar8);
      DescriptorBuilder::ResolveFeaturesImpl<google::protobuf::Descriptor::ExtensionRange>
                (*(DescriptorBuilder **)this,
                 *(Edition *)
                  (*(long *)(*(long *)((long)&pEVar5->containing_type_ + lVar7) + 0x18) + 0x20),
                 proto_03,(ExtensionRange *)((long)&pEVar5->start_ + lVar7),
                 *(OptionsType **)((long)&pEVar5->options_ + lVar7),*(FlatAllocator **)(this + 8),
                 NAME,false);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x28;
    } while (lVar8 < descriptor->extension_range_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }